

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,FormattedBytes *FB)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  uchar UC;
  uint uVar7;
  byte *pbVar8;
  byte *__n;
  byte *extraout_RDX;
  byte *extraout_RDX_00;
  byte *extraout_RDX_01;
  byte *extraout_RDX_02;
  byte *extraout_RDX_03;
  byte *__buf;
  byte *extraout_RDX_04;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  undefined8 in_R9;
  byte *pbVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  Optional<unsigned_long> Width;
  Optional<unsigned_long> Width_00;
  byte *local_58;
  uchar *local_48;
  
  uVar3 = (FB->Bytes).Length;
  if (uVar3 != 0) {
    local_48 = (FB->Bytes).Data;
    if ((FB->FirstByteOffset).Storage.hasVal == true) {
      lVar10 = (uVar3 - uVar3 % (ulong)FB->NumPerLine) + (FB->FirstByteOffset).Storage.field_0.value
      ;
      uVar11 = lVar10 - 1;
      if (uVar11 == 0) {
        uVar7 = 0x40;
      }
      else {
        lVar5 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        uVar7 = (uint)lVar5 ^ 0x3f;
      }
      local_58 = (byte *)(ulong)(0x43 - uVar7 >> 2);
      if (local_58 < (byte *)0x5) {
        local_58 = (byte *)0x4;
      }
      if (lVar10 == 0) {
        local_58 = (byte *)0x4;
      }
    }
    else {
      local_58 = (byte *)0x0;
    }
    uVar11 = (ulong)FB->ByteGroupSize;
    if (uVar11 == 0) {
      __assert_fail("Align != 0u && \"Align can\'t be 0.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/MathExtras.h"
                    ,0x2ce,"uint64_t llvm::alignTo(uint64_t, uint64_t, uint64_t)");
    }
    uVar7 = FB->Upper ^ 1;
    uVar2 = FB->NumPerLine;
    uVar14 = 0;
    iVar6 = (int)(((uVar11 + uVar2) - 1) / uVar11);
    pbVar8 = (byte *)(ulong)((iVar6 + uVar2 * 2) - 1);
    __n = pbVar8;
    uVar11 = uVar3;
    do {
      indent(this,FB->IndentLevel);
      __buf = extraout_RDX;
      if ((FB->FirstByteOffset).Storage.hasVal == true) {
        Width.Storage._8_8_ = in_R9;
        Width.Storage.field_0.value = 1;
        __n = local_58;
        llvm::write_hex((llvm *)this,
                        (raw_ostream *)((FB->FirstByteOffset).Storage.field_0.value + uVar14),
                        (ulong)uVar7,(HexPrintStyle)local_58,Width);
        Str.Length = 2;
        Str.Data = ": ";
        operator<<(this,Str);
        __buf = extraout_RDX_00;
      }
      uVar9 = FB->NumPerLine;
      uVar15 = (ulong)uVar9;
      uVar13 = uVar15;
      if (uVar11 < uVar15) {
        uVar13 = uVar11;
      }
      if (uVar15 == 0) {
        pbVar12 = (byte *)0x0;
      }
      else {
        pbVar12 = (byte *)0x0;
        uVar15 = 0;
        do {
          if ((uVar15 != 0) && (uVar15 % (ulong)FB->ByteGroupSize == 0)) {
            pbVar12 = pbVar12 + 1;
            Str_00.Length = 1;
            Str_00.Data = " ";
            operator<<(this,Str_00);
          }
          __n = (byte *)0x2;
          Width_00.Storage._8_8_ = in_R9;
          Width_00.Storage.field_0.value = 1;
          llvm::write_hex((llvm *)this,(raw_ostream *)(ulong)local_48[uVar15],(ulong)uVar7,
                          PrefixUpper,Width_00);
          uVar15 = uVar15 + 1;
          pbVar12 = pbVar12 + 2;
          __buf = extraout_RDX_01;
        } while (uVar13 + (uVar13 == 0) != uVar15);
      }
      if (FB->ASCII != false) {
        if (pbVar8 < pbVar12) {
          __assert_fail("BlockCharWidth >= CharsPrinted",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                        ,0x1c7,"raw_ostream &llvm::raw_ostream::operator<<(const FormattedBytes &)")
          ;
        }
        indent(this,(iVar6 + uVar2 * 2 + 1) - (int)pbVar12);
        Str_01.Length = 1;
        Str_01.Data = "|";
        operator<<(this,Str_01);
        __buf = extraout_RDX_02;
        if (uVar9 != 0) {
          uVar15 = 0;
          do {
            bVar1 = local_48[uVar15];
            __buf = (byte *)this->OutBufEnd;
            __n = (byte *)this->OutBufCur;
            if ((byte)(bVar1 - 0x20) < 0x5f) {
              if (__n < __buf) {
                __buf = __n + 1;
                this->OutBufCur = (char *)__buf;
                *__n = bVar1;
              }
              else {
                uVar9 = (uint)bVar1;
LAB_00b28026:
                write(this,uVar9,__buf,(size_t)__n);
                __buf = extraout_RDX_03;
              }
            }
            else {
              if (__buf <= __n) {
                uVar9 = 0x2e;
                goto LAB_00b28026;
              }
              this->OutBufCur = (char *)(__n + 1);
              *__n = 0x2e;
            }
            uVar15 = uVar15 + 1;
          } while (uVar13 != uVar15);
        }
        pcVar4 = this->OutBufCur;
        if (pcVar4 < this->OutBufEnd) {
          __n = (byte *)(pcVar4 + 1);
          this->OutBufCur = (char *)__n;
          *pcVar4 = '|';
        }
        else {
          write(this,0x7c,__buf,(size_t)__n);
          __buf = extraout_RDX_04;
        }
      }
      uVar14 = uVar14 + uVar13;
      if (uVar14 < uVar3) {
        pcVar4 = this->OutBufCur;
        if (pcVar4 < this->OutBufEnd) {
          __n = (byte *)(pcVar4 + 1);
          this->OutBufCur = (char *)__n;
          *pcVar4 = '\n';
        }
        else {
          write(this,10,__buf,(size_t)__n);
        }
      }
      uVar11 = uVar11 - uVar13;
      local_48 = local_48 + uVar13;
    } while (uVar11 != 0);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const FormattedBytes &FB) {
  if (FB.Bytes.empty())
    return *this;

  size_t LineIndex = 0;
  auto Bytes = FB.Bytes;
  const size_t Size = Bytes.size();
  HexPrintStyle HPS = FB.Upper ? HexPrintStyle::Upper : HexPrintStyle::Lower;
  uint64_t OffsetWidth = 0;
  if (FB.FirstByteOffset.hasValue()) {
    // Figure out how many nibbles are needed to print the largest offset
    // represented by this data set, so that we can align the offset field
    // to the right width.
    size_t Lines = Size / FB.NumPerLine;
    uint64_t MaxOffset = *FB.FirstByteOffset + Lines * FB.NumPerLine;
    unsigned Power = 0;
    if (MaxOffset > 0)
      Power = llvm::Log2_64_Ceil(MaxOffset);
    OffsetWidth = std::max<uint64_t>(4, llvm::alignTo(Power, 4) / 4);
  }

  // The width of a block of data including all spaces for group separators.
  unsigned NumByteGroups =
      alignTo(FB.NumPerLine, FB.ByteGroupSize) / FB.ByteGroupSize;
  unsigned BlockCharWidth = FB.NumPerLine * 2 + NumByteGroups - 1;

  while (!Bytes.empty()) {
    indent(FB.IndentLevel);

    if (FB.FirstByteOffset.hasValue()) {
      uint64_t Offset = FB.FirstByteOffset.getValue();
      llvm::write_hex(*this, Offset + LineIndex, HPS, OffsetWidth);
      *this << ": ";
    }

    auto Line = Bytes.take_front(FB.NumPerLine);

    size_t CharsPrinted = 0;
    // Print the hex bytes for this line in groups
    for (size_t I = 0; I < Line.size(); ++I, CharsPrinted += 2) {
      if (I && (I % FB.ByteGroupSize) == 0) {
        ++CharsPrinted;
        *this << " ";
      }
      llvm::write_hex(*this, Line[I], HPS, 2);
    }

    if (FB.ASCII) {
      // Print any spaces needed for any bytes that we didn't print on this
      // line so that the ASCII bytes are correctly aligned.
      assert(BlockCharWidth >= CharsPrinted);
      indent(BlockCharWidth - CharsPrinted + 2);
      *this << "|";

      // Print the ASCII char values for each byte on this line
      for (uint8_t Byte : Line) {
        if (isPrint(Byte))
          *this << static_cast<char>(Byte);
        else
          *this << '.';
      }
      *this << '|';
    }

    Bytes = Bytes.drop_front(Line.size());
    LineIndex += Line.size();
    if (LineIndex < Size)
      *this << '\n';
  }
  return *this;
}